

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateBuilder
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  FieldGenerator *pFVar2;
  Descriptor *in_RDX;
  Descriptor *descriptor;
  ulong uVar3;
  ulong extraout_RDX;
  int i_1;
  int iVar4;
  Descriptor *message;
  long lVar5;
  java *pjVar6;
  int i;
  long lVar7;
  string local_50;
  
  ClassName_abi_cxx11_(&local_50,(java *)this->descriptor_,in_RDX);
  io::Printer::Print(printer,
                     "public static Builder newBuilder() { return Builder.create(); }\npublic Builder newBuilderForType() { return newBuilder(); }\npublic static Builder newBuilder($classname$ prototype) {\n  return newBuilder().mergeFrom(prototype);\n}\npublic Builder toBuilder() { return newBuilder(this); }\n\n"
                     ,"classname",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  message = this->descriptor_;
  if (*(int *)(*(long *)(*(long *)(message + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,
                       "@java.lang.Override\nprotected Builder newBuilderForType(\n    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n  Builder builder = new Builder(parent);\n  return builder;\n}\n"
                      );
    message = this->descriptor_;
  }
  WriteMessageDocComment(printer,message);
  pjVar6 = (java *)this->descriptor_;
  iVar4 = *(int *)(*(long *)(*(long *)(pjVar6 + 0x10) + 0x88) + 0x50);
  if (*(int *)(pjVar6 + 0x58) < 1) {
    if (iVar4 == 3) {
      ClassName_abi_cxx11_(&local_50,pjVar6,descriptor);
      io::Printer::Print(printer,
                         "public static final class Builder extends\n    com.google.protobuf.GeneratedMessageLite.Builder<\n      $classname$, Builder>\n    implements $classname$OrBuilder {\n"
                         ,"classname",&local_50);
    }
    else {
      ClassName_abi_cxx11_(&local_50,pjVar6,descriptor);
      io::Printer::Print(printer,
                         "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage.Builder<Builder>\n   implements $classname$OrBuilder {\n"
                         ,"classname",&local_50);
    }
  }
  else if (iVar4 == 3) {
    ClassName_abi_cxx11_(&local_50,pjVar6,descriptor);
    io::Printer::Print(printer,
                       "public static final class Builder extends\n    com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<\n      $classname$, Builder> implements $classname$OrBuilder {\n"
                       ,"classname",&local_50);
  }
  else {
    ClassName_abi_cxx11_(&local_50,pjVar6,descriptor);
    io::Printer::Print(printer,
                       "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage.ExtendableBuilder<\n      $classname$, Builder> implements $classname$OrBuilder {\n"
                       ,"classname",&local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  io::Printer::Indent(printer);
  GenerateDescriptorMethods(this,printer);
  GenerateCommonBuilderMethods(this,printer);
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 2) {
    GenerateIsInitialized(this,printer,DONT_MEMOIZE);
    GenerateBuilderParsingMethods(this,printer);
  }
  lVar5 = 0;
  iVar4 = 0;
  for (lVar7 = 0; lVar7 < *(int *)(this->descriptor_ + 0x2c); lVar7 = lVar7 + 1) {
    pFVar2 = FieldGeneratorMap::get
                       (&this->field_generators_,
                        (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar5));
    iVar1 = (*pFVar2->_vptr_FieldGenerator[3])(pFVar2);
    iVar4 = iVar4 + iVar1;
    lVar5 = lVar5 + 0x78;
  }
  iVar1 = (iVar4 + 0x1f) / 0x20;
  uVar3 = (long)(iVar4 + 0x1f) % 0x20 & 0xffffffff;
  pjVar6 = (java *)0x0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (; iVar1 != (int)pjVar6; pjVar6 = (java *)(ulong)((int)pjVar6 + 1)) {
    GetBitFieldName_abi_cxx11_(&local_50,pjVar6,(int)uVar3);
    io::Printer::Print(printer,"private int $bit_field_name$;\n","bit_field_name",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    uVar3 = extraout_RDX;
  }
  lVar7 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(this->descriptor_ + 0x2c); lVar5 = lVar5 + 1) {
    io::Printer::Print(printer,"\n");
    anon_unknown_5::PrintFieldComment
              (printer,(FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar7));
    pFVar2 = FieldGeneratorMap::get
                       (&this->field_generators_,
                        (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar7));
    (*pFVar2->_vptr_FieldGenerator[6])(pFVar2,printer);
    lVar7 = lVar7 + 0x78;
  }
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(builder_scope:$full_name$)\n",
                     "full_name",*(string **)(this->descriptor_ + 8));
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::GenerateBuilder(io::Printer* printer) {
  printer->Print(
    "public static Builder newBuilder() { return Builder.create(); }\n"
    "public Builder newBuilderForType() { return newBuilder(); }\n"
    "public static Builder newBuilder($classname$ prototype) {\n"
    "  return newBuilder().mergeFrom(prototype);\n"
    "}\n"
    "public Builder toBuilder() { return newBuilder(this); }\n"
    "\n",
    "classname", ClassName(descriptor_));

  if (HasNestedBuilders(descriptor_)) {
     printer->Print(
      "@java.lang.Override\n"
      "protected Builder newBuilderForType(\n"
      "    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n"
      "  Builder builder = new Builder(parent);\n"
      "  return builder;\n"
      "}\n");
  }

  WriteMessageDocComment(printer, descriptor_);

  if (descriptor_->extension_range_count() > 0) {
    if (HasDescriptorMethods(descriptor_)) {
      printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessage.ExtendableBuilder<\n"
        "      $classname$, Builder> implements $classname$OrBuilder {\n",
        "classname", ClassName(descriptor_));
    } else {
      printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<\n"
        "      $classname$, Builder> implements $classname$OrBuilder {\n",
        "classname", ClassName(descriptor_));
    }
  } else {
    if (HasDescriptorMethods(descriptor_)) {
      printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessage.Builder<Builder>\n"
         "   implements $classname$OrBuilder {\n",
        "classname", ClassName(descriptor_));
    } else {
      printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessageLite.Builder<\n"
        "      $classname$, Builder>\n"
        "    implements $classname$OrBuilder {\n",
        "classname", ClassName(descriptor_));
    }
  }
  printer->Indent();

  GenerateDescriptorMethods(printer);
  GenerateCommonBuilderMethods(printer);

  if (HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer, DONT_MEMOIZE);
    GenerateBuilderParsingMethods(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits += field_generators_.get(descriptor_->field(i))
        .GetNumBitsForBuilder();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    PrintFieldComment(printer, descriptor_->field(i));
    field_generators_.get(descriptor_->field(i))
                     .GenerateBuilderMembers(printer);
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(builder_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n");
}